

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O3

string * __thiscall
Assimp::XFileExporter::toXFileString_abi_cxx11_
          (string *__return_storage_ptr__,XFileExporter *this,aiString *name)

{
  byte bVar1;
  long *plVar2;
  pointer pcVar3;
  size_type sVar4;
  size_type *psVar5;
  long lVar6;
  string pref;
  allocator<char> local_59;
  long *local_58 [2];
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,name->data,&local_59);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,(ulong)local_58[0]);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    lVar6 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  sVar4 = plVar2[1];
  __return_storage_ptr__->_M_string_length = sVar4;
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
    sVar4 = __return_storage_ptr__->_M_string_length;
  }
  if (0 < (int)sVar4) {
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    lVar6 = 0;
    do {
      bVar1 = pcVar3[lVar6];
      if (((char)bVar1 < '0') ||
         ((0x39 < bVar1 && ((bVar1 < 0x41 || (0x19 < (byte)(bVar1 + 0x9f) && 0x5a < bVar1)))))) {
        pcVar3[lVar6] = '_';
        pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
        sVar4 = __return_storage_ptr__->_M_string_length;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (int)sVar4);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string XFileExporter::toXFileString(aiString &name)
{
    std::string pref = ""; // node name prefix to prevent unexpected start of string
    std::string str = pref + std::string(name.C_Str());
    for (int i=0; i < (int) str.length(); ++i)
    {
        if ((str[i] >= '0' && str[i] <= '9') || // 0-9
            (str[i] >= 'A' && str[i] <= 'Z') || // A-Z
            (str[i] >= 'a' && str[i] <= 'z')) // a-z
            continue;
        str[i] = '_';
    }
    return str;
}